

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O3

ssize_t __thiscall
uWS::WebSocket<false>::send(WebSocket<false> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  ulong uVar2;
  void *pvVar3;
  ushort uVar4;
  byte bVar5;
  Socket *pSVar6;
  byte bVar7;
  undefined1 uVar8;
  uint uVar9;
  long *plVar10;
  ssize_t extraout_RAX;
  ssize_t sVar11;
  long extraout_RAX_00;
  code *pcVar12;
  uint *puVar13;
  undefined4 in_register_00000034;
  undefined8 *puVar14;
  uv_poll_t *puVar15;
  undefined4 in_register_00000084;
  long in_R9;
  char *memory;
  long lVar16;
  long lVar17;
  bool wasTransferred_1;
  bool wasTransferred;
  char local_5a;
  char local_59;
  long local_58;
  code *local_50;
  void *local_48;
  Socket *local_40;
  long *local_38;
  
  local_48 = (void *)CONCAT44(in_register_00000034,__fd);
  bVar5 = (byte)__n;
  plVar10 = (long *)((this->super_Socket).p)->data;
  local_50 = (code *)CONCAT44(in_register_00000084,__flags);
  uVar4 = (ushort)__buf;
  local_58 = in_R9;
  local_40 = &this->super_Socket;
  if (plVar10[4] != 0) {
    plVar10 = (long *)operator_new__((long)__buf + 0x3e);
    plVar10[1] = (long)__buf + 0xe;
    *plVar10 = (long)(plVar10 + 6);
    plVar10[2] = 0;
    if (__buf < (void *)0x7e) {
      bVar7 = (byte)__buf | 0x80;
      lVar16 = 2;
    }
    else if (__buf < (void *)0x10000) {
      *(ushort *)((long)plVar10 + 0x32) = uVar4 << 8 | uVar4 >> 8;
      lVar16 = 4;
      bVar7 = 0xfe;
    }
    else {
      *(ulong *)((long)plVar10 + 0x32) =
           (ulong)__buf >> 0x38 | ((ulong)__buf & 0xff000000000000) >> 0x28 |
           ((ulong)__buf & 0xff0000000000) >> 0x18 | ((ulong)__buf & 0xff00000000) >> 8 |
           ((ulong)__buf & 0xff000000) << 8 | ((ulong)__buf & 0xff0000) << 0x18 |
           ((ulong)__buf & 0xff00) << 0x28 | (long)__buf << 0x38;
      lVar16 = 10;
      bVar7 = 0xff;
    }
    *(byte *)(plVar10 + 6) = bVar5 | 0x80;
    *(byte *)((long)plVar10 + 0x31) = bVar7;
    uVar9 = rand();
    *(uint *)((long)plVar10 + lVar16 + 0x30) = uVar9;
    puVar13 = (uint *)((long)(plVar10 + 6) + lVar16 + 4);
    memcpy(puVar13,local_48,(size_t)__buf);
    if (0 < (long)__buf) {
      puVar1 = (uint *)((long)__buf + (long)puVar13);
      do {
        *puVar13 = *puVar13 ^ uVar9;
        puVar13 = puVar13 + 1;
      } while (puVar13 < puVar1);
    }
    plVar10[1] = lVar16 + 4 + (long)__buf;
    plVar10[3] = (long)local_50;
    plVar10[4] = local_58;
    pvVar3 = ((Socket *)&local_40->p)->p->data;
    plVar10[2] = 0;
    puVar14 = (undefined8 *)(*(long *)((long)pvVar3 + 0x28) + 0x10);
    if (*(long *)((long)pvVar3 + 0x28) == 0) {
      puVar14 = (undefined8 *)((long)pvVar3 + 0x20);
    }
    *puVar14 = plVar10;
    *(long **)((long)pvVar3 + 0x28) = plVar10;
    return (ssize_t)pvVar3;
  }
  uVar2 = (long)__buf + 0x3e;
  if (uVar2 < 0x401) {
    lVar17 = ((uVar2 >> 4) + 1) - (ulong)((uVar2 & 0xf) == 0);
    lVar16 = *(long *)(*plVar10 + 0x28);
    plVar10 = *(long **)(lVar16 + lVar17 * 8);
    if (plVar10 == (long *)0x0) {
      plVar10 = (long *)operator_new__(lVar17 * 0x10);
    }
    else {
      *(undefined8 *)(lVar16 + lVar17 * 8) = 0;
    }
    local_38 = plVar10 + 6;
    *plVar10 = (long)local_38;
    if (__buf < (void *)0x7e) {
      bVar7 = (byte)__buf | 0x80;
      lVar16 = 2;
    }
    else if (__buf < (void *)0x10000) {
      *(ushort *)((long)plVar10 + 0x32) = uVar4 << 8 | uVar4 >> 8;
      lVar16 = 4;
      bVar7 = 0xfe;
    }
    else {
      *(ulong *)((long)plVar10 + 0x32) =
           (ulong)__buf >> 0x38 | ((ulong)__buf & 0xff000000000000) >> 0x28 |
           ((ulong)__buf & 0xff0000000000) >> 0x18 | ((ulong)__buf & 0xff00000000) >> 8 |
           ((ulong)__buf & 0xff000000) << 8 | ((ulong)__buf & 0xff0000) << 0x18 |
           ((ulong)__buf & 0xff00) << 0x28 | (long)__buf << 0x38;
      lVar16 = 10;
      bVar7 = 0xff;
    }
    *(byte *)(plVar10 + 6) = bVar5 | 0x80;
    *(byte *)((long)plVar10 + 0x31) = bVar7;
    uVar9 = rand();
    *(uint *)((long)plVar10 + lVar16 + 0x30) = uVar9;
    puVar13 = (uint *)((long)local_38 + lVar16 + 4);
    memcpy(puVar13,local_48,(size_t)__buf);
    pSVar6 = local_40;
    if (0 < (long)__buf) {
      __n = (size_t)puVar13;
      do {
        *(uint *)__n = *(uint *)__n ^ uVar9;
        __n = __n + 4;
      } while (__n < (uint *)((long)__buf + (long)puVar13));
    }
    plVar10[1] = lVar16 + 4 + (long)__buf;
    sVar11 = uS::Socket::write(local_40,(int)plVar10,&local_59,__n);
    pcVar12 = local_50;
    if ((char)sVar11 == '\0') {
      if (local_50 == (code *)0x0) {
        return 0;
      }
      puVar15 = pSVar6->p;
LAB_00114c4e:
      sVar11 = (*local_50)(puVar15,local_58,1,0);
      return sVar11;
    }
    if (local_59 == '\0') {
      lVar16 = *(long *)(*pSVar6->p->data + 0x28);
      if (*(long *)(lVar16 + lVar17 * 8) == 0) {
        *(long **)(lVar16 + lVar17 * 8) = plVar10;
      }
      else {
        operator_delete__(plVar10);
        lVar16 = extraout_RAX_00;
      }
      if (pcVar12 == (code *)0x0) {
        return lVar16;
      }
      puVar15 = pSVar6->p;
LAB_00114c91:
      sVar11 = (*pcVar12)(puVar15,local_58,0,0);
      return sVar11;
    }
  }
  else {
    plVar10 = (long *)operator_new__(uVar2);
    plVar10[1] = (long)__buf + 0xe;
    *plVar10 = (long)(plVar10 + 6);
    plVar10[2] = 0;
    if (__buf < (void *)0x10000) {
      *(ushort *)((long)plVar10 + 0x32) = uVar4 << 8 | uVar4 >> 8;
      lVar16 = 4;
      uVar8 = 0xfe;
    }
    else {
      *(ulong *)((long)plVar10 + 0x32) =
           (ulong)__buf >> 0x38 | ((ulong)__buf & 0xff000000000000) >> 0x28 |
           ((ulong)__buf & 0xff0000000000) >> 0x18 | ((ulong)__buf & 0xff00000000) >> 8 |
           ((ulong)__buf & 0xff000000) << 8 | ((ulong)__buf & 0xff0000) << 0x18 |
           ((ulong)__buf & 0xff00) << 0x28 | (long)__buf << 0x38;
      lVar16 = 10;
      uVar8 = 0xff;
    }
    *(byte *)(plVar10 + 6) = bVar5 | 0x80;
    *(undefined1 *)((long)plVar10 + 0x31) = uVar8;
    uVar9 = rand();
    *(uint *)((long)plVar10 + lVar16 + 0x30) = uVar9;
    puVar13 = (uint *)((long)(plVar10 + 6) + lVar16 + 4);
    memcpy(puVar13,local_48,(size_t)__buf);
    pSVar6 = local_40;
    if (0 < (long)__buf) {
      __n = (size_t)puVar13;
      do {
        *(uint *)__n = *(uint *)__n ^ uVar9;
        __n = __n + 4;
      } while (__n < (uint *)((long)__buf + (long)puVar13));
    }
    plVar10[1] = lVar16 + 4 + (long)__buf;
    sVar11 = uS::Socket::write(local_40,(int)plVar10,&local_5a,__n);
    pcVar12 = local_50;
    if ((char)sVar11 == '\0') {
      if (local_50 == (code *)0x0) {
        return 0;
      }
      puVar15 = pSVar6->p;
      goto LAB_00114c4e;
    }
    if (local_5a == '\0') {
      operator_delete__(plVar10);
      if (pcVar12 == (code *)0x0) {
        return extraout_RAX;
      }
      puVar15 = pSVar6->p;
      goto LAB_00114c91;
    }
  }
  plVar10[3] = (long)local_50;
  plVar10[4] = local_58;
  return local_58;
}

Assistant:

void WebSocket<isServer>::send(const char *message, size_t length, OpCode opCode, void(*callback)(void *webSocket, void *data, bool cancelled, void *reserved), void *callbackData) {
    const int HEADER_LENGTH = WebSocketProtocol<!isServer>::LONG_MESSAGE_HEADER;

    if (hasEmptyQueue()) {
        if (length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH <= uS::NodeData::preAllocMaxSize) {
            int memoryLength = length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH;
            int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

            uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
            messagePtr->data = ((char *) messagePtr) + sizeof(uS::SocketData::Queue::Message);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);

            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        } else {
            uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    freeMessage(messagePtr);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        }
    } else {
        uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
        messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
        messagePtr->callback = callback;
        messagePtr->callbackData = callbackData;
        enqueue(messagePtr);
    }
}